

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O2

bool testFromCStr(String *str)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  
  pcVar4 = (str->view_)._M_str;
  if (pcVar4 == cstr) {
    iVar2 = 0x89;
    pcVar4 = "ASSERT_TRUE(str.data() != cstr) failed on line ";
  }
  else if ((str->view_)._M_len == 3) {
    iVar2 = strncmp(pcVar4,cstr,3);
    if (iVar2 == 0) {
      bVar1 = cm::String::is_stable(str);
      if (bVar1) {
        return true;
      }
      iVar2 = 0x8c;
      pcVar4 = "ASSERT_TRUE(str.is_stable()) failed on line ";
    }
    else {
      iVar2 = 0x8b;
      pcVar4 = "ASSERT_TRUE(std::strncmp(str.data(), cstr, 3) == 0) failed on line ";
    }
  }
  else {
    iVar2 = 0x8a;
    pcVar4 = "ASSERT_TRUE(str.size() == 3) failed on line ";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"\n");
  return false;
}

Assistant:

static bool testFromCStr(cm::String const& str)
{
  ASSERT_TRUE(str.data() != cstr);
  ASSERT_TRUE(str.size() == 3);
  ASSERT_TRUE(std::strncmp(str.data(), cstr, 3) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}